

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WFXMLScanner.cpp
# Opt level: O0

void __thiscall xercesc_4_0::WFXMLScanner::scanEndTag(WFXMLScanner *this,bool *gotData)

{
  XMLSize_t XVar1;
  XMLDocumentHandler *pXVar2;
  XMLElementDecl *pXVar3;
  bool bVar4;
  bool bVar5;
  RuntimeException *this_00;
  StackElem *pSVar6;
  XMLCh *pXVar7;
  XMLSize_t XVar8;
  QName *this_01;
  uint local_4c;
  bool isRoot;
  StackElem *topElem;
  uint uriId;
  bool *gotData_local;
  WFXMLScanner *this_local;
  
  *gotData = true;
  bVar4 = ElemStack::isEmpty(&(this->super_XMLScanner).fElemStack);
  if (!bVar4) {
    if (((this->super_XMLScanner).fDoNamespaces & 1U) == 0) {
      local_4c = (this->super_XMLScanner).fEmptyNamespaceId;
    }
    else {
      local_4c = ElemStack::getCurrentURI(&(this->super_XMLScanner).fElemStack);
    }
    pSVar6 = ElemStack::popTop(&(this->super_XMLScanner).fElemStack);
    bVar4 = ElemStack::isEmpty(&(this->super_XMLScanner).fElemStack);
    pXVar7 = XMLElementDecl::getFullName(pSVar6->fThisElement);
    bVar5 = ReaderMgr::skippedStringLong(&(this->super_XMLScanner).fReaderMgr,pXVar7);
    if (bVar5) {
      XVar1 = pSVar6->fReaderNum;
      XVar8 = ReaderMgr::getCurrentReaderNum(&(this->super_XMLScanner).fReaderMgr);
      if (XVar1 != XVar8) {
        XMLScanner::emitError(&this->super_XMLScanner,PartialTagMarkupError);
      }
      ReaderMgr::skipPastSpaces(&(this->super_XMLScanner).fReaderMgr);
      bVar5 = ReaderMgr::skippedChar(&(this->super_XMLScanner).fReaderMgr,L'>');
      if (!bVar5) {
        pXVar7 = XMLElementDecl::getFullName(pSVar6->fThisElement);
        XMLScanner::emitError
                  (&this->super_XMLScanner,UnterminatedEndTag,pXVar7,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
      if ((this->super_XMLScanner).fDocHandler != (XMLDocumentHandler *)0x0) {
        pXVar2 = (this->super_XMLScanner).fDocHandler;
        pXVar3 = pSVar6->fThisElement;
        this_01 = XMLElementDecl::getElementName(pSVar6->fThisElement);
        pXVar7 = QName::getPrefix(this_01);
        (*pXVar2->_vptr_XMLDocumentHandler[6])(pXVar2,pXVar3,(ulong)local_4c,(ulong)bVar4,pXVar7);
      }
      *gotData = (bool)((bVar4 ^ 0xffU) & 1);
    }
    else {
      pXVar7 = XMLElementDecl::getFullName(pSVar6->fThisElement);
      XMLScanner::emitError
                (&this->super_XMLScanner,ExpectedEndOfTagX,pXVar7,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
      ReaderMgr::skipPastChar(&(this->super_XMLScanner).fReaderMgr,L'>');
    }
    return;
  }
  XMLScanner::emitError(&this->super_XMLScanner,MoreEndThanStartTags);
  ReaderMgr::skipPastChar(&(this->super_XMLScanner).fReaderMgr,L'>');
  this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
  RuntimeException::RuntimeException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/WFXMLScanner.cpp"
             ,0x29f,Scan_UnbalancedStartEnd,(this->super_XMLScanner).fMemoryManager);
  __cxa_throw(this_00,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
}

Assistant:

void WFXMLScanner::scanEndTag(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the end of the root element.
    gotData = true;

    //  Check if the element stack is empty. If so, then this is an unbalanced
    //  element (i.e. more ends than starts, perhaps because of bad text
    //  causing one to be skipped.)
    if (fElemStack.isEmpty())
    {
        emitError(XMLErrs::MoreEndThanStartTags);
        fReaderMgr.skipPastChar(chCloseAngle);
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Scan_UnbalancedStartEnd, fMemoryManager);
    }

    //  Pop the stack of the element we are supposed to be ending. Remember
    //  that we don't own this. The stack just keeps them and reuses them.
    unsigned int uriId = (fDoNamespaces)
        ? fElemStack.getCurrentURI() : fEmptyNamespaceId;
    const ElemStack::StackElem* topElem = fElemStack.popTop();

    // See if it was the root element, to avoid multiple calls below
    const bool isRoot = fElemStack.isEmpty();

    // Make sure that its the end of the element that we expect
    if (!fReaderMgr.skippedStringLong(topElem->fThisElement->getFullName()))
    {
        emitError
        (
            XMLErrs::ExpectedEndOfTagX
            , topElem->fThisElement->getFullName()
        );
        fReaderMgr.skipPastChar(chCloseAngle);
        return;
    }

    // Make sure we are back on the same reader as where we started
    if (topElem->fReaderNum != fReaderMgr.getCurrentReaderNum())
        emitError(XMLErrs::PartialTagMarkupError);

    // Skip optional whitespace
    fReaderMgr.skipPastSpaces();

    // Make sure we find the closing bracket
    if (!fReaderMgr.skippedChar(chCloseAngle))
    {
        emitError
        (
            XMLErrs::UnterminatedEndTag
            , topElem->fThisElement->getFullName()
        );
    }

    // If we have a doc handler, tell it about the end tag
    if (fDocHandler)
    {
        fDocHandler->endElement
        (
            *topElem->fThisElement
            , uriId
            , isRoot
            , topElem->fThisElement->getElementName()->getPrefix()
        );
    }

    // If this was the root, then done with content
    gotData = !isRoot;
}